

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

shared_ptr<void> __thiscall
pstore::storage::address_to_pointer_impl<pstore::storage,std::shared_ptr<void>>
          (storage *this,storage *storage,address addr)

{
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<void> sVar2;
  shared_ptr<void> segment_base;
  shared_ptr<void> local_40;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = &segment_base_impl<pstore::storage,std::shared_ptr<void>const&>
                      (storage,(segment_type)(addr.a_ >> 0x16))->
            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,p_Var1);
  std::static_pointer_cast<unsigned_char,void>(&local_40);
  (this->sat_)._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (array<pstore::sat_entry,_65536UL> *)
       ((ulong)((uint)addr.a_ & 0x3fffff) +
       (long)local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->file_,&local_30._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  sVar2.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar2.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline auto storage::address_to_pointer_impl (Storage & storage, address const addr) noexcept
        -> ResultType {
        auto segment_base = storage.segment_base (addr.segment ());
        using uint8_type = typename inherit_const<Storage, std::uint8_t>::type;
        return {segment_base,
                std::static_pointer_cast<uint8_type> (segment_base).get () + addr.offset ()};
    }